

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::protos::gen::PerfEvents_RawEvent::Serialize(PerfEvents_RawEvent *this,Message *msg)

{
  uint8_t *src_begin;
  ulong uVar1;
  
  uVar1 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  if ((uVar1 & 2) != 0) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,1,this->type_);
    uVar1 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar1 & 4) != 0) {
    protozero::Message::AppendVarInt<unsigned_long>(msg,2,this->config_);
    uVar1 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar1 & 8) != 0) {
    protozero::Message::AppendVarInt<unsigned_long>(msg,3,this->config1_);
    uVar1 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar1 & 0x10) != 0) {
    protozero::Message::AppendVarInt<unsigned_long>(msg,4,this->config2_);
  }
  src_begin = (uint8_t *)(this->unknown_fields_)._M_dataplus._M_p;
  protozero::Message::WriteToStream
            (msg,src_begin,src_begin + (this->unknown_fields_)._M_string_length);
  return;
}

Assistant:

void PerfEvents_RawEvent::Serialize(::protozero::Message* msg) const {
  // Field 1: type
  if (_has_field_[1]) {
    msg->AppendVarInt(1, type_);
  }

  // Field 2: config
  if (_has_field_[2]) {
    msg->AppendVarInt(2, config_);
  }

  // Field 3: config1
  if (_has_field_[3]) {
    msg->AppendVarInt(3, config1_);
  }

  // Field 4: config2
  if (_has_field_[4]) {
    msg->AppendVarInt(4, config2_);
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}